

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O1

pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>,_const_google::protobuf::FieldDescriptor_*>,_absl::lts_20240722::hash_internal::Hash<std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>,_const_google::protobuf::FieldDescriptor_*>_>_>::iterator,_bool>
* __thiscall
absl::lts_20240722::container_internal::
raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::pair<void_const*,std::basic_string_view<char,std::char_traits<char>>>,google::protobuf::FieldDescriptor_const*>,absl::lts_20240722::hash_internal::Hash<std::pair<void_const*,std::basic_string_view<char,std::char_traits<char>>>>,std::equal_to<std::pair<void_const*,std::basic_string_view<char,std::char_traits<char>>>>,std::allocator<std::pair<std::pair<void_const*,std::basic_string_view<char,std::char_traits<char>>>const,google::protobuf::FieldDescriptor_const*>>>
::
find_or_prepare_insert_non_soo<std::pair<void_const*,std::basic_string_view<char,std::char_traits<char>>>>
          (pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>,_const_google::protobuf::FieldDescriptor_*>,_absl::lts_20240722::hash_internal::Hash<std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>,_const_google::protobuf::FieldDescriptor_*>_>_>::iterator,_bool>
           *__return_storage_ptr__,
          raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::pair<void_const*,std::basic_string_view<char,std::char_traits<char>>>,google::protobuf::FieldDescriptor_const*>,absl::lts_20240722::hash_internal::Hash<std::pair<void_const*,std::basic_string_view<char,std::char_traits<char>>>>,std::equal_to<std::pair<void_const*,std::basic_string_view<char,std::char_traits<char>>>>,std::allocator<std::pair<std::pair<void_const*,std::basic_string_view<char,std::char_traits<char>>>const,google::protobuf::FieldDescriptor_const*>>>
          *this,pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_> *key)

{
  char *pcVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  uint uVar5;
  ushort uVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  bool bVar22;
  char cVar23;
  ushort uVar24;
  uint uVar25;
  MixingHashState MVar26;
  anon_union_8_1_a8a14541_for_iterator_2 aVar27;
  ctrl_t *pcVar28;
  ulong uVar29;
  bool bVar30;
  ulong uVar31;
  long lVar32;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar39 [16];
  FindInfo FVar40;
  __m128i match;
  ulong local_90;
  char cVar33;
  char cVar36;
  char cVar37;
  char cVar38;
  
  MVar26 = hash_internal::HashStateBase<absl::lts_20240722::hash_internal::MixingHashState>::
           combine<void_const*,std::basic_string_view<char,std::char_traits<char>>>
                     ((MixingHashState)&hash_internal::MixingHashState::kSeed,&key->first,
                      &key->second);
  uVar2 = *(ulong *)this;
  if ((uVar2 + 1 & uVar2) != 0) {
    __assert_fail("((mask + 1) & mask) == 0 && \"not a mask\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0x145,
                  "absl::container_internal::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]")
    ;
  }
  uVar3 = *(ulong *)(this + 0x10);
  uVar31 = (MVar26.state_ >> 7 ^ uVar3 >> 0xc) & uVar2;
  auVar34 = ZEXT216(CONCAT11((char)MVar26.state_,(char)MVar26.state_) & 0x7f7f);
  auVar34 = pshuflw(auVar34,auVar34,0);
  pcVar28 = (__return_storage_ptr__->first).ctrl_;
  aVar27 = (__return_storage_ptr__->first).field_1;
  bVar30 = __return_storage_ptr__->second;
  local_90 = 0;
  do {
    pcVar1 = (char *)(uVar3 + uVar31);
    cVar23 = *pcVar1;
    cVar7 = pcVar1[1];
    cVar8 = pcVar1[2];
    cVar9 = pcVar1[3];
    cVar10 = pcVar1[4];
    cVar11 = pcVar1[5];
    cVar12 = pcVar1[6];
    cVar13 = pcVar1[7];
    cVar14 = pcVar1[8];
    cVar15 = pcVar1[9];
    cVar16 = pcVar1[10];
    cVar17 = pcVar1[0xb];
    cVar18 = pcVar1[0xc];
    cVar19 = pcVar1[0xd];
    cVar20 = pcVar1[0xe];
    cVar21 = pcVar1[0xf];
    cVar33 = auVar34[0];
    auVar35[0] = -(cVar33 == cVar23);
    cVar36 = auVar34[1];
    auVar35[1] = -(cVar36 == cVar7);
    cVar37 = auVar34[2];
    auVar35[2] = -(cVar37 == cVar8);
    cVar38 = auVar34[3];
    auVar35[3] = -(cVar38 == cVar9);
    auVar35[4] = -(cVar33 == cVar10);
    auVar35[5] = -(cVar36 == cVar11);
    auVar35[6] = -(cVar37 == cVar12);
    auVar35[7] = -(cVar38 == cVar13);
    auVar35[8] = -(cVar33 == cVar14);
    auVar35[9] = -(cVar36 == cVar15);
    auVar35[10] = -(cVar37 == cVar16);
    auVar35[0xb] = -(cVar38 == cVar17);
    auVar35[0xc] = -(cVar33 == cVar18);
    auVar35[0xd] = -(cVar36 == cVar19);
    auVar35[0xe] = -(cVar37 == cVar20);
    auVar35[0xf] = -(cVar38 == cVar21);
    uVar24 = (ushort)(SUB161(auVar35 >> 7,0) & 1) | (ushort)(SUB161(auVar35 >> 0xf,0) & 1) << 1 |
             (ushort)(SUB161(auVar35 >> 0x17,0) & 1) << 2 |
             (ushort)(SUB161(auVar35 >> 0x1f,0) & 1) << 3 |
             (ushort)(SUB161(auVar35 >> 0x27,0) & 1) << 4 |
             (ushort)(SUB161(auVar35 >> 0x2f,0) & 1) << 5 |
             (ushort)(SUB161(auVar35 >> 0x37,0) & 1) << 6 |
             (ushort)(SUB161(auVar35 >> 0x3f,0) & 1) << 7 |
             (ushort)(SUB161(auVar35 >> 0x47,0) & 1) << 8 |
             (ushort)(SUB161(auVar35 >> 0x4f,0) & 1) << 9 |
             (ushort)(SUB161(auVar35 >> 0x57,0) & 1) << 10 |
             (ushort)(SUB161(auVar35 >> 0x5f,0) & 1) << 0xb |
             (ushort)(SUB161(auVar35 >> 0x67,0) & 1) << 0xc |
             (ushort)(SUB161(auVar35 >> 0x6f,0) & 1) << 0xd |
             (ushort)(SUB161(auVar35 >> 0x77,0) & 1) << 0xe | (ushort)(auVar35[0xf] >> 7) << 0xf;
    uVar25 = (uint)uVar24;
    while (uVar24 != 0) {
      uVar5 = 0;
      if (uVar25 != 0) {
        for (; (uVar25 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
        }
      }
      uVar29 = uVar5 + uVar31 & uVar2;
      lVar32 = uVar29 * 0x20;
      bVar22 = std::
               equal_to<std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
               ::operator()((equal_to<std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
                             *)this,(pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>
                                     *)(*(long *)(this + 0x18) + lVar32),key);
      if (bVar22) {
        (__return_storage_ptr__->first).field_1 = aVar27;
        __return_storage_ptr__->second = bVar30;
        (__return_storage_ptr__->first).ctrl_ = pcVar28;
        if (*(long *)(this + 0x10) != 0) {
          lVar4 = *(long *)(this + 0x18);
          (__return_storage_ptr__->first).ctrl_ = (ctrl_t *)(*(long *)(this + 0x10) + uVar29);
          (__return_storage_ptr__->first).field_1.slot_ = (slot_type *)(lVar32 + lVar4);
          __return_storage_ptr__->second = false;
          return __return_storage_ptr__;
        }
        goto LAB_00216e32;
      }
      uVar24 = (ushort)(uVar25 - 1) & (ushort)uVar25;
      uVar25 = CONCAT22((short)(uVar25 - 1 >> 0x10),uVar24);
    }
    auVar39[0] = -(cVar23 == -0x80);
    auVar39[1] = -(cVar7 == -0x80);
    auVar39[2] = -(cVar8 == -0x80);
    auVar39[3] = -(cVar9 == -0x80);
    auVar39[4] = -(cVar10 == -0x80);
    auVar39[5] = -(cVar11 == -0x80);
    auVar39[6] = -(cVar12 == -0x80);
    auVar39[7] = -(cVar13 == -0x80);
    auVar39[8] = -(cVar14 == -0x80);
    auVar39[9] = -(cVar15 == -0x80);
    auVar39[10] = -(cVar16 == -0x80);
    auVar39[0xb] = -(cVar17 == -0x80);
    auVar39[0xc] = -(cVar18 == -0x80);
    auVar39[0xd] = -(cVar19 == -0x80);
    auVar39[0xe] = -(cVar20 == -0x80);
    auVar39[0xf] = -(cVar21 == -0x80);
    uVar24 = (ushort)(SUB161(auVar39 >> 7,0) & 1) | (ushort)(SUB161(auVar39 >> 0xf,0) & 1) << 1 |
             (ushort)(SUB161(auVar39 >> 0x17,0) & 1) << 2 |
             (ushort)(SUB161(auVar39 >> 0x1f,0) & 1) << 3 |
             (ushort)(SUB161(auVar39 >> 0x27,0) & 1) << 4 |
             (ushort)(SUB161(auVar39 >> 0x2f,0) & 1) << 5 |
             (ushort)(SUB161(auVar39 >> 0x37,0) & 1) << 6 |
             (ushort)(SUB161(auVar39 >> 0x3f,0) & 1) << 7 |
             (ushort)(SUB161(auVar39 >> 0x47,0) & 1) << 8 |
             (ushort)(SUB161(auVar39 >> 0x4f,0) & 1) << 9 |
             (ushort)(SUB161(auVar39 >> 0x57,0) & 1) << 10 |
             (ushort)(SUB161(auVar39 >> 0x5f,0) & 1) << 0xb |
             (ushort)(SUB161(auVar39 >> 0x67,0) & 1) << 0xc |
             (ushort)(SUB161(auVar39 >> 0x6f,0) & 1) << 0xd |
             (ushort)(SUB161(auVar39 >> 0x77,0) & 1) << 0xe | (ushort)(auVar39[0xf] >> 7) << 0xf;
    if (uVar24 == 0) {
      if (*(ulong *)this < local_90 + 0x10) {
        (__return_storage_ptr__->first).field_1 = aVar27;
        __return_storage_ptr__->second = bVar30;
        (__return_storage_ptr__->first).ctrl_ = pcVar28;
        __assert_fail("seq.index() <= capacity() && \"full table!\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0xef5,
                      "std::pair<iterator, bool> absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<std::pair<const void *, std::basic_string_view<char>>, const google::protobuf::FieldDescriptor *>, absl::hash_internal::Hash<std::pair<const void *, std::basic_string_view<char>>>, std::equal_to<std::pair<const void *, std::basic_string_view<char>>>, std::allocator<std::pair<const std::pair<const void *, std::basic_string_view<char>>, const google::protobuf::FieldDescriptor *>>>::find_or_prepare_insert_non_soo(const K &) [Policy = absl::container_internal::FlatHashMapPolicy<std::pair<const void *, std::basic_string_view<char>>, const google::protobuf::FieldDescriptor *>, Hash = absl::hash_internal::Hash<std::pair<const void *, std::basic_string_view<char>>>, Eq = std::equal_to<std::pair<const void *, std::basic_string_view<char>>>, Alloc = std::allocator<std::pair<const std::pair<const void *, std::basic_string_view<char>>, const google::protobuf::FieldDescriptor *>>, K = std::pair<const void *, std::basic_string_view<char>>]"
                     );
      }
      uVar31 = uVar31 + local_90 + 0x10 & uVar2;
      local_90 = local_90 + 0x10;
    }
    else {
      cVar23 = absl::lts_20240722::container_internal::ShouldInsertBackwardsForDebug
                         (*(ulong *)this,MVar26.state_,*(ctrl_t **)(this + 0x10));
      if (cVar23 == '\0') {
        uVar25 = 0;
        if (uVar24 != 0) {
          for (; (uVar24 >> uVar25 & 1) == 0; uVar25 = uVar25 + 1) {
          }
        }
      }
      else {
        uVar6 = 0xf;
        if (uVar24 != 0) {
          for (; uVar24 >> uVar6 == 0; uVar6 = uVar6 - 1) {
          }
        }
        uVar25 = (ushort)((uVar6 ^ 0xfff0) + 0x11) - 1;
      }
      FVar40.offset = uVar25 + uVar31 & uVar2;
      FVar40.probe_length = local_90;
      lVar32 = absl::lts_20240722::container_internal::PrepareInsertNonSoo
                         ((CommonFields *)this,MVar26.state_,FVar40,
                          (PolicyFunctions *)GetPolicyFunctions()::value);
      if (*(long *)(this + 0x10) == 0) {
        (__return_storage_ptr__->first).field_1 = aVar27;
        __return_storage_ptr__->second = bVar30;
        (__return_storage_ptr__->first).ctrl_ = pcVar28;
LAB_00216e32:
        __assert_fail("ctrl != nullptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0x9c4,
                      "absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<std::pair<const void *, std::basic_string_view<char>>, const google::protobuf::FieldDescriptor *>, absl::hash_internal::Hash<std::pair<const void *, std::basic_string_view<char>>>, std::equal_to<std::pair<const void *, std::basic_string_view<char>>>, std::allocator<std::pair<const std::pair<const void *, std::basic_string_view<char>>, const google::protobuf::FieldDescriptor *>>>::iterator::iterator(ctrl_t *, slot_type *, const GenerationType *) [Policy = absl::container_internal::FlatHashMapPolicy<std::pair<const void *, std::basic_string_view<char>>, const google::protobuf::FieldDescriptor *>, Hash = absl::hash_internal::Hash<std::pair<const void *, std::basic_string_view<char>>>, Eq = std::equal_to<std::pair<const void *, std::basic_string_view<char>>>, Alloc = std::allocator<std::pair<const std::pair<const void *, std::basic_string_view<char>>, const google::protobuf::FieldDescriptor *>>]"
                     );
      }
      pcVar28 = (ctrl_t *)(*(long *)(this + 0x10) + lVar32);
      aVar27.slot_ = (slot_type *)(lVar32 * 0x20 + *(long *)(this + 0x18));
      bVar30 = true;
    }
    if (uVar24 != 0) {
      (__return_storage_ptr__->first).field_1.slot_ = (slot_type *)aVar27;
      __return_storage_ptr__->second = bVar30;
      (__return_storage_ptr__->first).ctrl_ = pcVar28;
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

std::pair<iterator, bool> find_or_prepare_insert_non_soo(const K& key) {
    assert(!is_soo());
    prefetch_heap_block();
    auto hash = hash_ref()(key);
    auto seq = probe(common(), hash);
    const ctrl_t* ctrl = control();
    while (true) {
      Group g{ctrl + seq.offset()};
      for (uint32_t i : g.Match(H2(hash))) {
        if (ABSL_PREDICT_TRUE(PolicyTraits::apply(
                EqualElement<K>{key, eq_ref()},
                PolicyTraits::element(slot_array() + seq.offset(i)))))
          return {iterator_at(seq.offset(i)), false};
      }
      auto mask_empty = g.MaskEmpty();
      if (ABSL_PREDICT_TRUE(mask_empty)) {
        size_t target = seq.offset(
            GetInsertionOffset(mask_empty, capacity(), hash, control()));
        return {iterator_at(PrepareInsertNonSoo(common(), hash,
                                                FindInfo{target, seq.index()},
                                                GetPolicyFunctions())),
                true};
      }
      seq.next();
      assert(seq.index() <= capacity() && "full table!");
    }
  }